

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_array_ensure_capacity
                  (mz_zip_archive *pZip,mz_zip_array *pArray,size_t min_new_capacity,mz_uint growing
                  )

{
  ulong uVar1;
  void *pvVar2;
  mz_bool mVar3;
  size_t sVar4;
  
  if (pArray->m_element_size == 0) {
    __assert_fail("pArray->m_element_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                  0x14ca,
                  "mz_bool mz_zip_array_ensure_capacity(mz_zip_archive *, mz_zip_array *, size_t, mz_uint)"
                 );
  }
  uVar1 = pArray->m_capacity;
  mVar3 = 1;
  if (uVar1 < min_new_capacity) {
    sVar4 = min_new_capacity;
    if (growing != 0) {
      uVar1 = uVar1 + (uVar1 == 0);
      do {
        sVar4 = uVar1;
        uVar1 = sVar4 * 2;
      } while (sVar4 < min_new_capacity);
    }
    pvVar2 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,pArray->m_p,(size_t)pArray->m_element_size,
                                 sVar4);
    if (pvVar2 == (void *)0x0) {
      mVar3 = 0;
    }
    else {
      pArray->m_p = pvVar2;
      pArray->m_capacity = sVar4;
    }
  }
  return mVar3;
}

Assistant:

static mz_bool mz_zip_array_ensure_capacity(mz_zip_archive *pZip,
                                            mz_zip_array *pArray,
                                            size_t min_new_capacity,
                                            mz_uint growing) {
  void *pNew_p;
  size_t new_capacity = min_new_capacity;
  MZ_ASSERT(pArray->m_element_size);
  if (pArray->m_capacity >= min_new_capacity)
    return MZ_TRUE;
  if (growing) {
    new_capacity = MZ_MAX(1, pArray->m_capacity);
    while (new_capacity < min_new_capacity)
      new_capacity *= 2;
  }
  if (NULL == (pNew_p = pZip->m_pRealloc(pZip->m_pAlloc_opaque, pArray->m_p,
                                         pArray->m_element_size, new_capacity)))
    return MZ_FALSE;
  pArray->m_p = pNew_p;
  pArray->m_capacity = new_capacity;
  return MZ_TRUE;
}